

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O1

Am_String Am_Get_Time_And_Date(void)

{
  char *string;
  Am_String_Data *in_RDI;
  time_t time_ptr;
  time_t tStack_18;
  
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = (_func_int **)0x0;
  time(&tStack_18);
  string = ctime(&tStack_18);
  Am_String::operator=((Am_String *)in_RDI,string);
  return (Am_String)in_RDI;
}

Assistant:

Am_String
Am_Get_Time_And_Date()
{
  Am_String str;
  time_t time_ptr;
  time(&time_ptr);

  char *s = ctime(&time_ptr);
  str = s;
  return str;
}